

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

uint8_t duckdb_decimal_width(duckdb_logical_type type)

{
  ExtraTypeInfo *pEVar1;
  optional_ptr<duckdb::ExtraTypeInfo,_true> oStack_8;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x15)) {
    oStack_8.ptr = *(ExtraTypeInfo **)(type + 8);
    pEVar1 = duckdb::optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&oStack_8);
    return *(uint8_t *)&pEVar1[1]._vptr_ExtraTypeInfo;
  }
  return '\0';
}

Assistant:

static bool AssertLogicalTypeId(duckdb_logical_type type, duckdb::LogicalTypeId type_id) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != type_id) {
		return false;
	}
	return true;
}